

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O2

MPP_RET vdpp2_control(VdppCtx ictx,VdppCmd cmd,void *iparam)

{
  int iVar1;
  uint __errnum;
  int iVar2;
  MPP_RET MVar3;
  uint uVar4;
  uint *puVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  size_t __n;
  char *fmt;
  void *__dest;
  
  if ((ictx == (VdppCtx)0x0) || (cmd != VDPP_CMD_RUN_SYNC && iparam == (void *)0x0)) {
    _mpp_log_l(2,"vdpp2","found NULL iparam %p cmd %d ctx %p\n","vdpp2_control",iparam,(ulong)cmd,
               ictx);
    return MPP_ERR_NULL_PTR;
  }
  switch(cmd) {
  case VDPP_CMD_SET_COM2_CFG:
  case VDPP_CMD_SET_ES:
  case VDPP_CMD_SET_DCI_HIST:
  case VDPP_CMD_SET_SHARP:
    goto switchD_0013f873_caseD_2000;
  case VDPP_CMD_SET_DST_C:
    *(undefined8 *)((long)ictx + 0x68) = *iparam;
    *(undefined4 *)((long)ictx + 0x70) = *(undefined4 *)((long)iparam + 8);
    return MPP_OK;
  case VDPP_CMD_SET_HIST_FD:
    *(undefined4 *)((long)ictx + 0x74) = *iparam;
    return MPP_OK;
  default:
    if (1 < cmd - VDPP_CMD_SET_ZME_COM_CFG) {
      if (cmd == VDPP_CMD_SET_SRC) {
        *(undefined8 *)((long)ictx + 0x50) = *iparam;
        *(undefined4 *)((long)ictx + 0x58) = *(undefined4 *)((long)iparam + 8);
        return MPP_OK;
      }
      if (cmd == VDPP_CMD_SET_DST) {
        *(undefined8 *)((long)ictx + 0x5c) = *iparam;
        *(undefined4 *)((long)ictx + 100) = *(undefined4 *)((long)iparam + 8);
        return MPP_OK;
      }
      if (cmd != VDPP_CMD_SET_COM_CFG) {
        if (cmd == VDPP_CMD_RUN_SYNC) {
          MVar3 = vdpp2_start((vdpp2_api_ctx *)ictx);
          if (MVar3 != MPP_OK) {
            _mpp_log_l(2,"vdpp2","run vdpp failed\n","vdpp2_control");
            return MPP_NOK;
          }
          uVar4 = ioctl(*ictx,0x40047601);
          if (uVar4 != 0) {
            puVar5 = (uint *)__errno_location();
            __errnum = *puVar5;
            pcVar6 = strerror(__errnum);
            _mpp_log_l(2,"vdpp2","ioctl POLL_HW_FINISH failed ret %d errno %d %s\n","vdpp2_wait",
                       (ulong)uVar4,(ulong)__errnum,pcVar6);
          }
          if ((((((byte)vdpp2_debug & 2) != 0) &&
               (_mpp_log_l(4,"vdpp2","ro_frm_done_sts=%d\n",(char *)0x0,
                           (ulong)(*(byte *)((long)ictx + 0x778) & 1)), ((byte)vdpp2_debug & 2) != 0
               )) && (_mpp_log_l(4,"vdpp2","ro_osd_max_sts=%d\n",(char *)0x0,
                                 (ulong)(*(uint *)((long)ictx + 0x778) >> 1 & 1)),
                     ((byte)vdpp2_debug & 2) != 0)) &&
             ((_mpp_log_l(4,"vdpp2","ro_bus_error_sts=%d\n",(char *)0x0,
                          (ulong)(*(uint *)((long)ictx + 0x778) >> 4 & 1)),
              ((byte)vdpp2_debug & 2) != 0 &&
              (_mpp_log_l(4,"vdpp2","ro_timeout_sts=%d\n",(char *)0x0,
                          (ulong)(*(uint *)((long)ictx + 0x778) >> 5 & 1)),
              ((byte)vdpp2_debug & 2) != 0)))) {
            _mpp_log_l(4,"vdpp2","ro_config_error_sts=%d\n",(char *)0x0,
                       (ulong)(*(uint *)((long)ictx + 0x778) >> 5 & 1));
          }
          if (((*(byte *)((long)ictx + 0x770) & 1) == 0) ||
             ((*(byte *)((long)ictx + 0x778) & 1) != 0)) {
            if (((byte)vdpp2_debug & 2) == 0) {
              return MPP_OK;
            }
            fmt = "run vdpp success\n";
            iVar8 = 4;
            pcVar6 = (char *)0x0;
          }
          else {
            fmt = "run vdpp failed\n";
            pcVar6 = "vdpp2_done";
            iVar8 = 2;
          }
          _mpp_log_l(iVar8,"vdpp2",fmt,pcVar6);
          return MPP_OK;
        }
        if (cmd != VDPP_CMD_SET_DMSR_CFG) {
          return MPP_OK;
        }
      }
    }
switchD_0013f873_caseD_2000:
    if (0x13 < *iparam) {
      return MPP_OK;
    }
  }
  switch(*iparam) {
  case 0:
    *(undefined4 *)((long)ictx + 0x728) = 0;
    *(undefined4 *)((long)ictx + 8) = 3;
    *(undefined4 *)((long)ictx + 0xc) = *(undefined4 *)((long)iparam + 8);
    *(undefined4 *)((long)ictx + 0x10) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0x14) = *(undefined4 *)((long)iparam + 0x10);
    iVar8 = *(int *)((long)iparam + 0x14);
    *(int *)((long)ictx + 0x18) = iVar8;
    iVar1 = *(int *)((long)iparam + 0x18);
    *(int *)((long)ictx + 0x1c) = iVar1;
    iVar7 = *(int *)((long)iparam + 0x1c);
    *(int *)((long)ictx + 0x28) = iVar7;
    iVar2 = *(int *)((long)iparam + 0x20);
    *(int *)((long)ictx + 0x2c) = iVar2;
    *(undefined1 *)((long)ictx + 0x78) = 1;
    *(undefined4 *)((long)ictx + 0x148) = 1;
    *(undefined4 *)((long)ictx + 0x1d4) = 1;
    if (*(int *)((long)ictx + 0x20) == 0) {
      *(uint *)((long)ictx + 0x20) = iVar8 + 0xfU & 0xfffffff0;
    }
    if (*(int *)((long)ictx + 0x24) == 0) {
      *(uint *)((long)ictx + 0x24) = iVar1 + 7U & 0xfffffff8;
    }
    if (iVar7 == 0) {
      *(int *)((long)ictx + 0x28) = iVar8;
      iVar7 = iVar8;
    }
    if (iVar2 == 0) {
      *(int *)((long)ictx + 0x2c) = iVar1;
      iVar2 = iVar1;
    }
    if (*(int *)((long)ictx + 0x30) == 0) {
      *(uint *)((long)ictx + 0x30) = iVar7 + 0xfU & 0xfffffff0;
    }
    if (*(int *)((long)ictx + 0x34) == 0) {
      *(uint *)((long)ictx + 0x34) = iVar2 + 1U & 0xfffffffe;
    }
    iVar8 = *(int *)((long)ictx + 0x3c);
    if (*(int *)((long)ictx + 0x3c) == 0) {
      *(int *)((long)ictx + 0x3c) = iVar7;
      iVar8 = iVar7;
    }
    if (*(int *)((long)ictx + 0x44) == 0) {
      *(uint *)((long)ictx + 0x44) = iVar8 + 0xfU & 0xfffffff0;
    }
    iVar8 = *(int *)((long)ictx + 0x40);
    if (*(int *)((long)ictx + 0x40) == 0) {
      *(int *)((long)ictx + 0x40) = iVar2;
      iVar8 = iVar2;
    }
    if (*(int *)((long)ictx + 0x48) == 0) {
      *(uint *)((long)ictx + 0x48) = iVar8 + 1U & 0xfffffffe;
    }
    goto LAB_0013fba4;
  case 1:
    __dest = (void *)((long)ictx + 0x78);
    __n = 0x84;
    goto LAB_0013fa6b;
  case 2:
    *(uint *)((long)ictx + 0x100) = (uint)*(byte *)((long)iparam + 8);
    *(uint *)((long)ictx + 0x104) = (uint)*(byte *)((long)iparam + 9);
    *(undefined4 *)((long)ictx + 0x108) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0x10c) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0x110) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0x114) = *(undefined4 *)((long)iparam + 0x18);
    break;
  case 3:
    if (*(long *)((long)iparam + 0x20) != 0) {
      *(long *)((long)ictx + 0x118) = *(long *)((long)iparam + 0x20);
    }
    if (*(long *)((long)iparam + 0x28) != 0) {
      *(long *)((long)ictx + 0x120) = *(long *)((long)iparam + 0x28);
    }
    break;
  case 0x10:
    uVar4 = *(uint *)((long)iparam + 0x50);
    *(undefined4 *)((long)ictx + 0xc) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 8) = *(undefined4 *)((long)iparam + 8);
    *(undefined4 *)((long)ictx + 0x10) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0x14) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0x18) = *(undefined4 *)((long)iparam + 0x18);
    *(undefined4 *)((long)ictx + 0x1c) = *(undefined4 *)((long)iparam + 0x1c);
    *(undefined4 *)((long)ictx + 0x20) = *(undefined4 *)((long)iparam + 0x20);
    *(undefined4 *)((long)ictx + 0x24) = *(undefined4 *)((long)iparam + 0x24);
    *(undefined4 *)((long)ictx + 0x28) = *(undefined4 *)((long)iparam + 0x28);
    *(undefined4 *)((long)ictx + 0x2c) = *(undefined4 *)((long)iparam + 0x2c);
    *(undefined4 *)((long)ictx + 0x30) = *(undefined4 *)((long)iparam + 0x30);
    *(undefined4 *)((long)ictx + 0x34) = *(undefined4 *)((long)iparam + 0x34);
    *(undefined4 *)((long)ictx + 0x38) = *(undefined4 *)((long)iparam + 0x38);
    *(undefined4 *)((long)ictx + 0x3c) = *(undefined4 *)((long)iparam + 0x3c);
    *(undefined4 *)((long)ictx + 0x40) = *(undefined4 *)((long)iparam + 0x40);
    *(undefined4 *)((long)ictx + 0x44) = *(undefined4 *)((long)iparam + 0x44);
    *(undefined4 *)((long)ictx + 0x48) = *(undefined4 *)((long)iparam + 0x48);
    *(uint *)((long)ictx + 0x4c) = 3 - (uint)(*(int *)((long)iparam + 0x4c) == 0);
    if ((uVar4 >> 0x12 & 1) != 0) {
      *(byte *)((long)ictx + 0x78) = (byte)uVar4 >> 2 & 1;
    }
    if ((uVar4 >> 0x11 & 1) != 0) {
      *(uint *)((long)ictx + 0x148) = uVar4 >> 1 & 1;
    }
    if ((uVar4 >> 0x10 & 1) != 0) {
      *(uint *)((long)ictx + 0x1d4) = uVar4 & 1;
    }
    goto LAB_0013fba4;
  case 0x11:
    memcpy((EsParams *)((long)ictx + 0x148),(void *)((long)iparam + 8),0x8c);
    update_es_tan((EsParams *)((long)ictx + 0x148));
    break;
  case 0x12:
    *(undefined4 *)((long)ictx + 0x728) = *(undefined4 *)((long)iparam + 8);
    *(undefined4 *)((long)ictx + 0x72c) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0x730) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0x734) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0x738) = *(undefined4 *)((long)iparam + 0x18);
    *(undefined4 *)((long)ictx + 0x748) = *(undefined4 *)((long)iparam + 0x1c);
LAB_0013fba4:
    update_dci_ctl((vdpp2_params *)((long)ictx + 8));
    break;
  case 0x13:
    __dest = (void *)((long)ictx + 0x1d4);
    __n = 0x554;
LAB_0013fa6b:
    memcpy(__dest,(void *)((long)iparam + 8),__n);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpp2_control(VdppCtx ictx, VdppCmd cmd, void *iparam)
{
    struct vdpp2_api_ctx *ctx = ictx;
    MPP_RET ret = MPP_OK;

    if ((NULL == iparam && VDPP_CMD_RUN_SYNC != cmd) ||
        (NULL == ictx)) {
        mpp_err_f("found NULL iparam %p cmd %d ctx %p\n", iparam, cmd, ictx);
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd) {
    case VDPP_CMD_SET_COM_CFG:
    case VDPP_CMD_SET_DMSR_CFG:
    case VDPP_CMD_SET_ZME_COM_CFG:
    case VDPP_CMD_SET_ZME_COEFF_CFG:
    case VDPP_CMD_SET_COM2_CFG:
    case VDPP_CMD_SET_ES:
    case VDPP_CMD_SET_DCI_HIST:
    case VDPP_CMD_SET_SHARP: {
        struct vdpp_api_params *param = (struct vdpp_api_params *)iparam;

        ret = vdpp2_set_param(ctx, &param->param, param->ptype);
        if (ret) {
            mpp_err_f("set vdpp parameter failed, type %d\n", param->ptype);
        }
        break;
    }
    case VDPP_CMD_SET_SRC:
        set_addr(&ctx->params.src, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST:
        set_addr(&ctx->params.dst, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST_C:
        set_addr(&ctx->params.dst_c, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_HIST_FD:
        ctx->params.hist = *(RK_S32 *)iparam;
        break;
    case VDPP_CMD_RUN_SYNC:
        ret = vdpp2_start(ctx);
        if (ret) {
            mpp_err_f("run vdpp failed\n");
            return MPP_NOK;
        }

        vdpp2_wait(ctx);
        vdpp2_done(ctx);
        break;
    default:
        ;
    }

    return ret;
}